

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_prepare_handshake_record(mbedtls_ssl_context *ssl)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  int *piVar4;
  mbedtls_ssl_handshake_params *pmVar5;
  uchar *puVar6;
  byte bVar7;
  int iVar8;
  int *piVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  size_t sVar13;
  long lVar14;
  ulong uVar15;
  byte bVar16;
  byte bVar17;
  size_t sVar18;
  uchar *puVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  uint local_40;
  
  uVar10 = ssl->in_msglen;
  uVar2 = (ulong)((ssl->conf->field_0x174 & 2) >> 1) * 8 + 4;
  if (uVar10 < uVar2) {
    return -0x7200;
  }
  piVar4 = (int *)ssl->in_msg;
  lVar14 = (ulong)*(byte *)((long)piVar4 + 1) * 0x10000;
  lVar21 = (ulong)*(byte *)((long)piVar4 + 2) * 0x100;
  bVar3 = *(byte *)((long)piVar4 + 3);
  uVar15 = (lVar21 + lVar14 | (ulong)bVar3) + uVar2;
  ssl->in_hslen = uVar15;
  if ((ssl->conf->field_0x174 & 2) == 0) {
    if (uVar15 <= uVar10) {
      return 0;
    }
    return -0x7080;
  }
  pmVar5 = ssl->handshake;
  if (pmVar5 != (mbedtls_ssl_handshake_params *)0x0) {
    uVar23 = (uint)(ushort)(*(ushort *)(piVar4 + 1) << 8 | *(ushort *)(piVar4 + 1) >> 8);
    if (ssl->state == 0x10) {
      if ((char)*piVar4 != '\x01') {
LAB_001130aa:
        if (((uVar23 == pmVar5->in_flight_start_seq - 1) && ((char)*piVar4 != '\x03')) &&
           (iVar8 = mbedtls_ssl_resend(ssl), iVar8 != 0)) {
          return iVar8;
        }
        return -0x6580;
      }
    }
    else if (uVar23 != pmVar5->in_msg_seq) goto LAB_001130aa;
  }
  if (((uVar10 < uVar15) || ((char)piVar4[2] != '\0' || *(short *)((long)piVar4 + 6) != 0)) ||
     (*(char *)((long)piVar4 + 0xb) != *(char *)((long)piVar4 + 3) ||
      *(short *)((long)piVar4 + 9) != *(short *)((long)piVar4 + 1))) {
    if (pmVar5 == (mbedtls_ssl_handshake_params *)0x0) {
      return -0x7080;
    }
    piVar9 = (int *)pmVar5->hs_msg;
    if (piVar9 != (int *)0x0) goto LAB_00113134;
    if (0x4000 < (uint)uVar15) {
      return -0x7080;
    }
    piVar9 = (int *)calloc(1,((uVar15 - 0xc >> 3) + uVar15 + 1) - (ulong)((uVar15 - 0xc & 7) == 0));
    pmVar5->hs_msg = (uchar *)piVar9;
    if (piVar9 == (int *)0x0) {
      return -0x7f00;
    }
    *piVar9 = *piVar4;
    *(short *)(piVar9 + 1) = (short)piVar4[1];
    *(undefined2 *)((long)piVar9 + 6) = 0;
    *(undefined1 *)(piVar9 + 2) = 0;
    *(undefined2 *)((long)piVar9 + 9) = *(undefined2 *)((long)piVar9 + 1);
    *(undefined1 *)((long)piVar9 + 0xb) = *(undefined1 *)((long)piVar9 + 3);
  }
  else {
    if (pmVar5 == (mbedtls_ssl_handshake_params *)0x0) {
      return 0;
    }
    piVar9 = (int *)pmVar5->hs_msg;
    if (piVar9 == (int *)0x0) {
      return 0;
    }
LAB_00113134:
    if (*piVar9 != *piVar4) {
      return -0x7200;
    }
  }
  uVar12 = uVar15 - 0xc;
  bVar7 = *(byte *)(piVar4 + 2);
  uVar20 = (ulong)((uint)*(byte *)((long)piVar4 + 7) << 8 |
                  (uint)*(byte *)((long)piVar4 + 6) << 0x10) | (ulong)bVar7;
  uVar23 = (uint)*(byte *)((long)piVar4 + 10) << 8 | (uint)*(byte *)((long)piVar4 + 9) << 0x10;
  bVar16 = *(byte *)((long)piVar4 + 0xb);
  sVar13 = (ulong)uVar23 + (ulong)bVar16;
  if (uVar12 < sVar13 + uVar20) {
    return -0x7200;
  }
  uVar1 = sVar13 + 0xc;
  if (uVar10 < uVar1) {
    return -0x7200;
  }
  memcpy((void *)((long)piVar9 + uVar20 + 0xc),piVar4 + 3,sVar13);
  if ((bVar7 & 7) != 0) {
    bVar7 = 8 - (bVar7 & 7);
    uVar10 = uVar20 >> 3;
    uVar22 = (uint)sVar13;
    uVar11 = (uint)bVar7;
    if (uVar22 < bVar7 || uVar22 == uVar11) {
      if (sVar13 == 0) goto LAB_00113383;
      bVar17 = *(byte *)((long)piVar9 + uVar10 + uVar15);
      local_40 = (uint)bVar16;
      iVar8 = uVar11 - (uVar23 + local_40);
      do {
        bVar17 = bVar17 | (byte)(1 << ((byte)iVar8 & 0x1f));
        iVar8 = iVar8 + 1;
        sVar13 = sVar13 - 1;
      } while (sVar13 != 0);
      *(byte *)((long)piVar9 + uVar10 + uVar15) = bVar17;
      sVar13 = 0;
    }
    else {
      bVar16 = *(byte *)((long)piVar9 + uVar10 + uVar15);
      do {
        uVar11 = uVar11 - 1;
        bVar16 = bVar16 | (byte)(1 << ((byte)uVar11 & 0x1f));
      } while (uVar11 != 0);
      uVar20 = uVar20 + bVar7;
      sVar13 = sVar13 - bVar7;
      *(byte *)((long)piVar9 + uVar10 + uVar15) = bVar16;
    }
    if (uVar22 <= bVar7) goto LAB_00113383;
  }
  if ((sVar13 & 7) != 0) {
    uVar10 = uVar20 + sVar13 >> 3;
    bVar7 = *(byte *)((long)piVar9 + uVar10 + uVar15);
    iVar8 = 8 - ((uint)sVar13 & 7);
    do {
      bVar7 = bVar7 | (byte)(1 << ((byte)iVar8 & 0x1f));
      iVar8 = iVar8 + 1;
    } while (iVar8 != 8);
    *(byte *)((long)piVar9 + uVar10 + uVar15) = bVar7;
  }
  memset((void *)((long)piVar9 + (uVar20 >> 3) + uVar15),0xff,sVar13 >> 3);
LAB_00113383:
  if (7 < uVar12) {
    uVar10 = 0;
    do {
      if (*(char *)((long)piVar9 + uVar10 + lVar21 + (ulong)bVar3 + uVar2 + lVar14) != -1) {
        return -0x6580;
      }
      uVar10 = uVar10 + 1;
    } while (uVar12 >> 3 != uVar10);
  }
  if ((uVar12 & 7) != 0) {
    lVar14 = 0;
    do {
      if ((*(byte *)((long)piVar9 + (uVar12 >> 3) + uVar15) >> ((int)lVar14 + 7U & 0x1f) & 1) == 0)
      {
        return -0x6580;
      }
      lVar14 = lVar14 + -1;
    } while (-lVar14 != (uVar12 & 7));
  }
  if (ssl->in_msglen <= uVar1) {
    uVar2 = ssl->next_record_offset;
    sVar13 = ssl->in_left - uVar2;
    if (uVar2 <= ssl->in_left && sVar13 != 0) {
      puVar6 = ssl->in_hdr;
      sVar18 = (long)(ssl->in_msg + ssl->in_hslen) - (long)puVar6;
      ssl->next_record_offset = sVar18;
      puVar19 = (uchar *)(sVar18 + sVar13);
      ssl->in_left = (size_t)puVar19;
      if (ssl->in_buf + (0x414d - (long)puVar6) < puVar19) {
        return -0x6a00;
      }
      memmove(ssl->in_msg + ssl->in_hslen,puVar6 + uVar2,sVar13);
    }
    memcpy(ssl->in_msg,ssl->handshake->hs_msg,ssl->in_hslen);
    free(ssl->handshake->hs_msg);
    ssl->handshake->hs_msg = (uchar *)0x0;
    return 0;
  }
  return -0x7080;
}

Assistant:

int mbedtls_ssl_prepare_handshake_record( mbedtls_ssl_context *ssl )
{
    if( ssl->in_msglen < mbedtls_ssl_hs_hdr_len( ssl ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "handshake message too short: %d",
                            ssl->in_msglen ) );
        return( MBEDTLS_ERR_SSL_INVALID_RECORD );
    }

    ssl->in_hslen = mbedtls_ssl_hs_hdr_len( ssl ) + (
                    ( ssl->in_msg[1] << 16 ) |
                    ( ssl->in_msg[2] << 8  ) |
                      ssl->in_msg[3] );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "handshake message: msglen ="
                        " %d, type = %d, hslen = %d",
                        ssl->in_msglen, ssl->in_msg[0], ssl->in_hslen ) );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        int ret;
        unsigned int recv_msg_seq = ( ssl->in_msg[4] << 8 ) | ssl->in_msg[5];

        if( ssl->handshake != NULL &&
            ( ( ssl->state   != MBEDTLS_SSL_HANDSHAKE_OVER &&
                recv_msg_seq != ssl->handshake->in_msg_seq ) ||
              ( ssl->state  == MBEDTLS_SSL_HANDSHAKE_OVER &&
                ssl->in_msg[0] != MBEDTLS_SSL_HS_CLIENT_HELLO ) ) )
        {
            /* Retransmit only on last message from previous flight, to avoid
             * too many retransmissions.
             * Besides, No sane server ever retransmits HelloVerifyRequest */
            if( recv_msg_seq == ssl->handshake->in_flight_start_seq - 1 &&
                ssl->in_msg[0] != MBEDTLS_SSL_HS_HELLO_VERIFY_REQUEST )
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "received message from last flight, "
                                    "message_seq = %d, start_of_flight = %d",
                                    recv_msg_seq,
                                    ssl->handshake->in_flight_start_seq ) );

                if( ( ret = mbedtls_ssl_resend( ssl ) ) != 0 )
                {
                    MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_resend", ret );
                    return( ret );
                }
            }
            else
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "dropping out-of-sequence message: "
                                    "message_seq = %d, expected = %d",
                                    recv_msg_seq,
                                    ssl->handshake->in_msg_seq ) );
            }

            return( MBEDTLS_ERR_SSL_CONTINUE_PROCESSING );
        }
        /* Wait until message completion to increment in_msg_seq */

        /* Reassemble if current message is fragmented or reassembly is
         * already in progress */
        if( ssl->in_msglen < ssl->in_hslen ||
            memcmp( ssl->in_msg + 6, "\0\0\0",        3 ) != 0 ||
            memcmp( ssl->in_msg + 9, ssl->in_msg + 1, 3 ) != 0 ||
            ( ssl->handshake != NULL && ssl->handshake->hs_msg != NULL ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "found fragmented DTLS handshake message" ) );

            if( ( ret = ssl_reassemble_dtls_handshake( ssl ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "ssl_reassemble_dtls_handshake", ret );
                return( ret );
            }
        }
    }
    else
#endif /* MBEDTLS_SSL_PROTO_DTLS */
    /* With TLS we don't handle fragmentation (for now) */
    if( ssl->in_msglen < ssl->in_hslen )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "TLS handshake fragmentation not supported" ) );
        return( MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE );
    }

    return( 0 );
}